

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  CppType CVar1;
  iterator iVar2;
  LogMessage *pLVar3;
  _Base_ptr p_Var4;
  LogFinisher local_5d;
  int number_local;
  LogMessage local_58;
  
  number_local = number;
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                  *)this,&number_local);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->extensions_)._M_t._M_impl.super__Rb_tree_header) {
    p_Var4 = (_Base_ptr)0x0;
  }
  else {
    if (*(char *)((long)&iVar2._M_node[1]._M_left + 1) != '\0') {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2a1);
      pLVar3 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=(&local_5d,pLVar3);
      LogMessage::~LogMessage(&local_58);
    }
    CVar1 = anon_unknown_29::cpp_type(*(FieldType *)&iVar2._M_node[1]._M_left);
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2a1);
      pLVar3 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_5d,pLVar3);
      LogMessage::~LogMessage(&local_58);
    }
    if (((ulong)iVar2._M_node[1]._M_left & 0x100000) == 0) {
      p_Var4 = iVar2._M_node[1]._M_parent;
      if (this->arena_ != (Arena *)0x0) {
        p_Var4 = (_Base_ptr)(**(code **)(*(long *)p_Var4 + 0x18))(p_Var4);
        (**(code **)(*(long *)p_Var4 + 0x50))(p_Var4,iVar2._M_node[1]._M_parent);
      }
    }
    else {
      p_Var4 = (_Base_ptr)
               (**(code **)(*(long *)iVar2._M_node[1]._M_parent + 0x38))
                         (iVar2._M_node[1]._M_parent,prototype);
      if ((this->arena_ == (Arena *)0x0) && (iVar2._M_node[1]._M_parent != (_Base_ptr)0x0)) {
        (**(code **)(*(long *)iVar2._M_node[1]._M_parent + 8))();
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
    ::erase((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
             *)this,&number_local);
  }
  return (MessageLite *)p_Var4;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  ExtensionMap::iterator iter = extensions_.find(number);
  if (iter == extensions_.end()) {
    // Not present.  Return NULL.
    return NULL;
  } else {
    GOOGLE_DCHECK_TYPE(iter->second, OPTIONAL, MESSAGE);
    MessageLite* ret = NULL;
    if (iter->second.is_lazy) {
      ret = iter->second.lazymessage_value->ReleaseMessage(prototype);
      if (arena_ == NULL) {
        delete iter->second.lazymessage_value;
      }
    } else {
      if (arena_ == NULL) {
        ret = iter->second.message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = (iter->second.message_value)->New();
        ret->CheckTypeAndMergeFrom(*iter->second.message_value);
      }
    }
    extensions_.erase(number);
    return ret;
  }
}